

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bv.c
# Opt level: O3

unsigned_long bv_get_bits(bv_t *bv,uint numbits)

{
  uint uVar1;
  uchar *puVar2;
  unsigned_long uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  
  if (bv == (bv_t *)0x0) {
    __assert_fail("bv != NULL","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/bv.c",
                  0x4c,"unsigned long bv_get_bits(bv_t *, unsigned int)");
  }
  puVar2 = bv->data;
  if (puVar2 != (uchar *)0x0) {
    uVar1 = bv->idx;
    if (uVar1 < bv->len) {
      uVar10 = uVar1 >> 3;
      uVar4 = uVar1 & 7;
      bv->idx = uVar1 + numbits;
      if (8 - uVar4 < numbits) {
        uVar8 = numbits + uVar4;
        uVar9 = (ulong)((2 << ((byte)uVar4 ^ 7)) - 1U & (uint)puVar2[uVar10]);
        if (uVar8 < 0x10) {
          uVar6 = (ulong)(uVar10 + 1);
        }
        else {
          uVar6 = (ulong)((uVar1 >> 3) + 1);
          iVar5 = (uVar8 >> 3) - 1;
          do {
            uVar9 = (ulong)puVar2[uVar6] | uVar9 << 8;
            uVar6 = uVar6 + 1;
            iVar5 = iVar5 + -1;
          } while (iVar5 != 0);
          uVar6 = uVar6 & 0xffffffff;
        }
        bVar7 = (byte)uVar8 & 7;
        uVar3 = (ulong)(puVar2[uVar6] >> (8 - bVar7 & 0x1f)) | uVar9 << bVar7;
      }
      else {
        uVar3 = (unsigned_long)
                (((uint)puVar2[uVar10] << (byte)uVar4 & 0xff) >> (8U - (char)numbits & 0x1f));
      }
      return uVar3;
    }
    __assert_fail("bv->len > bv->idx",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/bv.c",0x50,
                  "unsigned long bv_get_bits(bv_t *, unsigned int)");
  }
  __assert_fail("bv->data != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/bv.c",0x4d,
                "unsigned long bv_get_bits(bv_t *, unsigned int)");
}

Assistant:

unsigned long bv_get_bits(bv_t *bv, unsigned int numbits) {
  assert(bv != NULL);
  assert(bv->data != NULL);
  assert((numbits <= 32) ||
         "Can not read more than 32 bits from a bit vector");
  assert(bv->len > bv->idx);
  assert(((bv->len - bv->idx) > numbits) ||
         "Bit buffer of bit vector is too small");

  unsigned int cidx = bv->idx >> 3;      /* char index */
  /*M
    Bit overflow from previous char.
  **/
  unsigned int overflow = bv->idx & 0x7;

  bv->idx += numbits;

  /*M
    Most significant bit first.
  **/
  if (numbits <= (8 - overflow))
    return HIGHERBITS(bv->data[cidx] << overflow, numbits);

  /*M
    Length in bytes of bitstring.
  **/
  unsigned int len = ((numbits + overflow) >> 3) + 1;
  /*M
    Number of bits of bitstring in first byte.
  **/
  unsigned long res = LOWERBITS(bv->data[cidx++], 8 - overflow);
  unsigned int i;
  for (i = 1; i < len - 1; i++)
    res = (res << 8) | (bv->data[cidx++] & 0xFF);

  /*M
    Number of bits in last byte.
  **/
  unsigned int lastbits = (overflow + numbits) & 0x07;
  res = (res << lastbits) | HIGHERBITS(bv->data[cidx], lastbits);

  return res;
}